

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PsxRelocator.cpp
# Opt level: O1

bool __thiscall DirectivePsxObjImport::Validate(DirectivePsxObjImport *this,ValidateState *state)

{
  int64_t iVar1;
  int memory;
  int local_1c;
  
  iVar1 = FileManager::getVirtualAddress(g_fileManager);
  local_1c = (int)iVar1;
  PsxRelocator::relocate(&this->rel,&local_1c);
  FileManager::advanceMemory(g_fileManager,(long)local_1c);
  return (this->rel).dataChanged;
}

Assistant:

bool DirectivePsxObjImport::Validate(const ValidateState &state)
{
	int memory = (int) g_fileManager->getVirtualAddress();
	rel.relocate(memory);
	g_fileManager->advanceMemory(memory);
	return rel.hasDataChanged();
}